

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O0

int license::LicenseGenerator::generateLicense(int argc,char **argv)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  options_description *this;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  basic_command_line_parser<char> *pbVar4;
  size_type sVar5;
  variable_value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  bool local_591;
  undefined1 local_550 [8];
  fstream ofstream;
  ostream local_540 [519];
  allocator local_339;
  string local_338;
  string local_318 [8];
  string fname;
  key_type local_2f0;
  undefined4 local_2d0;
  allocator local_2c9;
  key_type local_2c8;
  basic_command_line_parser<char> local_2a8;
  basic_parsed_options<char> local_230;
  variables_map local_208 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1f8 [144];
  positional_options_description local_168 [8];
  positional_options_description p;
  undefined8 local_130 [3];
  options_description local_118 [8];
  options_description allOptions;
  options_description local_98 [8];
  options_description visibleOptions;
  char **argv_local;
  int argc_local;
  
  configureProgramOptions();
  boost::program_options::options_description::options_description(local_118,0x50,0x28);
  this = (options_description *)boost::program_options::options_description::add(local_118,local_98)
  ;
  local_130[0] = boost::program_options::options_description::add_options(this);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_130,"product",(value_semantic *)ptVar3,
             "product names");
  boost::program_options::positional_options_description::positional_options_description(local_168);
  boost::program_options::positional_options_description::add(local_168,"product",-1);
  boost::program_options::variables_map::variables_map(local_208);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_2a8,argc,argv);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::options(&local_2a8,local_118);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::positional(pbVar4,local_168);
  boost::program_options::basic_command_line_parser<char>::run(&local_230,pbVar4);
  boost::program_options::store((basic_parsed_options *)&local_230,local_208,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_230);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_2a8);
  boost::program_options::notify(local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"help",&local_2c9);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1f8,&local_2c8);
  local_591 = sVar5 == 0 && argc != 1;
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (local_591) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2f0,"output",(allocator *)(fname.field_2._M_local_buf + 0xf));
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1f8,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    if (sVar5 == 0) {
      generateAndOutputLicenses(local_208,(ostream *)std::cout);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_338,"output",&local_339);
      this_00 = boost::program_options::variables_map::operator[](local_208,&local_338);
      pbVar6 = boost::program_options::variable_value::as<std::__cxx11::string>(this_00);
      std::__cxx11::string::string(local_318,(string *)pbVar6);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      _Var2 = std::operator|(_S_out,_S_app);
      std::fstream::fstream(local_550,local_318,_Var2);
      bVar1 = std::fstream::is_open();
      if ((bVar1 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"can\'t open file [");
        poVar7 = std::operator<<(poVar7,local_318);
        poVar7 = std::operator<<(poVar7,"] for output.");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<(poVar7," error: ");
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        std::operator<<(poVar7,pcVar9);
        exit(3);
      }
      generateAndOutputLicenses(local_208,local_540);
      std::fstream::close();
      std::fstream::~fstream(local_550);
      std::__cxx11::string::~string(local_318);
    }
  }
  else {
    printHelp(*argv,local_98);
  }
  local_2d0 = 1;
  boost::program_options::variables_map::~variables_map(local_208);
  boost::program_options::positional_options_description::~positional_options_description(local_168)
  ;
  boost::program_options::options_description::~options_description(local_118);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int LicenseGenerator::generateLicense(int argc, const char **argv) {

	po::options_description visibleOptions = configureProgramOptions();
	//positional options must be added to standard options
	po::options_description allOptions;
	allOptions.add(visibleOptions).add_options()("product",
			po::value<vector<string>>(), "product names");

	po::positional_options_description p;
	p.add("product", -1);

	po::variables_map vm;
	po::store(
			po::command_line_parser(argc, argv).options(allOptions).positional(
					p).run(), vm);
	po::notify(vm);
	if (vm.count("help") || argc == 1) {
		printHelp(argv[0], visibleOptions);
		return 0;
	}

	if (vm.count("output")) {
		const std::string fname = vm["output"].as<string>();

		fstream ofstream(fname, std::ios::out | std::ios::app);
		if (!ofstream.is_open()) {
			cerr << "can't open file [" << fname << "] for output." << endl
					<< " error: " << strerror( errno);
			exit(3);
		}
		generateAndOutputLicenses(vm, ofstream);
		ofstream.close();
	} else {
		generateAndOutputLicenses(vm, cout);
	}
	return 0;
}